

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O0

void __thiscall
vkt::api::anon_unknown_0::CheckEnumerateInstanceExtensionPropertiesIncompleteResult::
~CheckEnumerateInstanceExtensionPropertiesIncompleteResult
          (CheckEnumerateInstanceExtensionPropertiesIncompleteResult *this)

{
  CheckEnumerateInstanceExtensionPropertiesIncompleteResult *this_local;
  
  (this->super_CheckIncompleteResult<vk::VkExtensionProperties>)._vptr_CheckIncompleteResult =
       (_func_int **)&PTR__CheckEnumerateInstanceExtensionPropertiesIncompleteResult_0165da60;
  std::__cxx11::string::~string((string *)&this->m_layerName);
  CheckIncompleteResult<vk::VkExtensionProperties>::~CheckIncompleteResult
            (&this->super_CheckIncompleteResult<vk::VkExtensionProperties>);
  return;
}

Assistant:

CheckEnumerateInstanceExtensionPropertiesIncompleteResult (std::string layerName = std::string()) : m_layerName(layerName) {}